

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O2

ModelWire * __thiscall
lsim::gui::CircuitEditor::ui_try_merge_wire_segment(CircuitEditor *this,ModelWireSegment *segment)

{
  ModelWire *this_00;
  bool bVar1;
  ModelWireJunction *pMVar2;
  ModelWire *pMVar3;
  int w;
  uint uVar4;
  Point *p;
  ModelWire *pMVar5;
  ModelWire *pMVar6;
  __node_base *p_Var7;
  Point end_points [2];
  ModelWire *local_48 [3];
  
  pMVar5 = (ModelWire *)0x0;
  pMVar2 = ModelWireSegment::junction(segment,0);
  end_points[0] = pMVar2->m_position;
  pMVar2 = ModelWireSegment::junction(segment,1);
  end_points[1] = pMVar2->m_position;
  p_Var7 = &(this->m_model_circuit->m_wires)._M_h._M_before_begin;
  pMVar3 = (ModelWire *)0x0;
LAB_001461cd:
  do {
    pMVar6 = segment->m_wire;
    do {
      p_Var7 = p_Var7->_M_nxt;
      if (p_Var7 == (__node_base *)0x0) goto LAB_00146256;
      this_00 = *(ModelWire **)&((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor;
    } while (pMVar6->m_id <= this_00->m_id);
    if ((pMVar3 == (ModelWire *)0x0) &&
       (bVar1 = ModelWire::point_on_wire(this_00,end_points), p = end_points, pMVar6 = this_00,
       bVar1)) {
LAB_00146231:
      pMVar3 = pMVar6;
      ModelWire::split_at_new_junction(this_00,p);
    }
    else if (pMVar5 == (ModelWire *)0x0) {
      bVar1 = ModelWire::point_on_wire(this_00,end_points + 1);
      pMVar5 = (ModelWire *)0x0;
      if (bVar1) {
        p = end_points + 1;
        pMVar5 = this_00;
        pMVar6 = pMVar3;
        goto LAB_00146231;
      }
      goto LAB_001461cd;
    }
    if (pMVar5 != (ModelWire *)0x0 && pMVar3 != (ModelWire *)0x0) {
      pMVar6 = segment->m_wire;
LAB_00146256:
      local_48[1] = pMVar5;
      local_48[0] = pMVar3;
      bVar1 = false;
      for (uVar4 = 1; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
        if (local_48[uVar4] != (ModelWire *)0x0) {
          ModelWire::merge(local_48[uVar4],pMVar6);
          ModelCircuit::remove_wire(this->m_model_circuit,pMVar6->m_id);
          pMVar6 = local_48[uVar4];
          bVar1 = true;
        }
      }
      if (!bVar1) {
        pMVar6 = segment->m_wire;
      }
      return pMVar6;
    }
  } while( true );
}

Assistant:

ModelWire* CircuitEditor::ui_try_merge_wire_segment(ModelWireSegment* segment) {

	ModelWire* target_wires[2] = { nullptr, nullptr };
	Point end_points[2] = { segment->junction(0)->position(), segment->junction(1)->position() };

	for (auto& iter : m_model_circuit->wires()) {
		auto wire = iter.second.get();
		if (wire->id() >= segment->wire()->id()) {
			continue;
		}
			
		if (target_wires[0] == nullptr && wire->point_on_wire(end_points[0])) {
			wire->split_at_new_junction(end_points[0]);
			target_wires[0] = wire;
		} else if (target_wires[1] == nullptr && wire->point_on_wire(end_points[1])) {
			wire->split_at_new_junction(end_points[1]);
			target_wires[1] = wire;
		}

		if (target_wires[0] != nullptr && target_wires[1] != nullptr) {
			break;
		}
	}

	auto wire_to_merge = segment->wire();
	bool merged = false;
	for (int w = 1; w >= 0; --w) {
		if (target_wires[w] != nullptr) {
			target_wires[w]->merge(wire_to_merge);
			m_model_circuit->remove_wire(wire_to_merge->id());
			wire_to_merge = target_wires[w];
			merged = true;
		}
	}

	return (merged) ? wire_to_merge : segment->wire();
}